

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableBeginApplyRequests(ImGuiTable *table)

{
  ImGuiTableColumnIdx *pIVar1;
  float width;
  char cVar2;
  char cVar3;
  char cVar4;
  ImGuiTableColumn *pIVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  char cVar9;
  int column_n;
  
  if (table->InstanceCurrent == 0) {
    cVar9 = table->ResizedColumn;
    if (cVar9 == -1) {
      cVar9 = -1;
    }
    else {
      width = table->ResizedColumnNextWidth;
      if ((width != 3.4028235e+38) || (NAN(width))) {
        TableSetColumnWidth((int)cVar9,width);
        cVar9 = table->ResizedColumn;
      }
    }
    table->LastResizedColumn = cVar9;
    table->ResizedColumnNextWidth = 3.4028235e+38;
    table->ResizedColumn = -1;
    column_n = (int)table->AutoFitSingleColumn;
    if (column_n != -1) {
      TableSetColumnWidth(column_n,(table->Columns).Data[column_n].WidthAuto);
      table->AutoFitSingleColumn = -1;
    }
    if (table->InstanceCurrent == 0) {
      cVar9 = table->ReorderColumn;
      if (table->HeldHeaderColumn == -1) {
        if (cVar9 != -1) {
          table->ReorderColumn = -1;
        }
        table->HeldHeaderColumn = -1;
      }
      else {
        table->HeldHeaderColumn = -1;
        if (cVar9 != -1) {
          cVar2 = table->ReorderColumnDir;
          lVar6 = (long)cVar2;
          if (lVar6 != 0) {
            pIVar5 = (table->Columns).Data;
            cVar3 = pIVar5[cVar9].DisplayOrder;
            lVar8 = (long)cVar3;
            cVar4 = pIVar5[*(char *)((long)&pIVar5[cVar9].Flags + ((ulong)(cVar2 == -1) ^ 0x55))].
                    DisplayOrder;
            pIVar5[cVar9].DisplayOrder = cVar4;
            lVar7 = lVar8;
            if (cVar3 != cVar4) {
              do {
                pIVar1 = &(table->Columns).Data[(table->DisplayOrderToIndex).Data[lVar7 + lVar6]].
                          DisplayOrder;
                *pIVar1 = *pIVar1 - cVar2;
                lVar8 = lVar8 + lVar6;
                lVar7 = lVar7 + lVar6;
              } while (lVar8 != cVar4);
            }
            if (0 < table->ColumnsCount) {
              lVar6 = 0x52;
              lVar7 = 0;
              do {
                (table->DisplayOrderToIndex).Data
                [*(char *)((long)&((table->Columns).Data)->Flags + lVar6)] = (char)lVar7;
                lVar7 = lVar7 + 1;
                lVar6 = lVar6 + 0x68;
              } while (lVar7 < table->ColumnsCount);
            }
            table->ReorderColumnDir = '\0';
            table->IsSettingsDirty = true;
          }
        }
      }
    }
  }
  if (table->IsResetDisplayOrderRequest == true) {
    if (0 < table->ColumnsCount) {
      lVar6 = 0x52;
      lVar7 = 0;
      do {
        *(char *)((long)&((table->Columns).Data)->Flags + lVar6) = (char)lVar7;
        (table->DisplayOrderToIndex).Data[lVar7] = (char)lVar7;
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x68;
      } while (lVar7 < table->ColumnsCount);
    }
    table->IsResetDisplayOrderRequest = false;
    table->IsSettingsDirty = true;
  }
  return;
}

Assistant:

void ImGui::TableBeginApplyRequests(ImGuiTable* table)
{
    // Handle resizing request
    // (We process this at the first TableBegin of the frame)
    // FIXME-TABLE: Contains columns if our work area doesn't allow for scrolling?
    if (table->InstanceCurrent == 0)
    {
        if (table->ResizedColumn != -1 && table->ResizedColumnNextWidth != FLT_MAX)
            TableSetColumnWidth(table->ResizedColumn, table->ResizedColumnNextWidth);
        table->LastResizedColumn = table->ResizedColumn;
        table->ResizedColumnNextWidth = FLT_MAX;
        table->ResizedColumn = -1;

        // Process auto-fit for single column, which is a special case for stretch columns and fixed columns with FixedSame policy.
        // FIXME-TABLE: Would be nice to redistribute available stretch space accordingly to other weights, instead of giving it all to siblings.
        if (table->AutoFitSingleColumn != -1)
        {
            TableSetColumnWidth(table->AutoFitSingleColumn, table->Columns[table->AutoFitSingleColumn].WidthAuto);
            table->AutoFitSingleColumn = -1;
        }
    }

    // Handle reordering request
    // Note: we don't clear ReorderColumn after handling the request.
    if (table->InstanceCurrent == 0)
    {
        if (table->HeldHeaderColumn == -1 && table->ReorderColumn != -1)
            table->ReorderColumn = -1;
        table->HeldHeaderColumn = -1;
        if (table->ReorderColumn != -1 && table->ReorderColumnDir != 0)
        {
            // We need to handle reordering across hidden columns.
            // In the configuration below, moving C to the right of E will lead to:
            //    ... C [D] E  --->  ... [D] E  C   (Column name/index)
            //    ... 2  3  4        ...  2  3  4   (Display order)
            const int reorder_dir = table->ReorderColumnDir;
            IM_ASSERT(reorder_dir == -1 || reorder_dir == +1);
            IM_ASSERT(table->Flags & ImGuiTableFlags_Reorderable);
            ImGuiTableColumn* src_column = &table->Columns[table->ReorderColumn];
            ImGuiTableColumn* dst_column = &table->Columns[(reorder_dir == -1) ? src_column->PrevEnabledColumn : src_column->NextEnabledColumn];
            IM_UNUSED(dst_column);
            const int src_order = src_column->DisplayOrder;
            const int dst_order = dst_column->DisplayOrder;
            src_column->DisplayOrder = (ImGuiTableColumnIdx)dst_order;
            for (int order_n = src_order + reorder_dir; order_n != dst_order + reorder_dir; order_n += reorder_dir)
                table->Columns[table->DisplayOrderToIndex[order_n]].DisplayOrder -= (ImGuiTableColumnIdx)reorder_dir;
            IM_ASSERT(dst_column->DisplayOrder == dst_order - reorder_dir);

            // Display order is stored in both columns->IndexDisplayOrder and table->DisplayOrder[],
            // rebuild the later from the former.
            for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImGuiTableColumnIdx)column_n;
            table->ReorderColumnDir = 0;
            table->IsSettingsDirty = true;
        }
    }

    // Handle display order reset request
    if (table->IsResetDisplayOrderRequest)
    {
        for (int n = 0; n < table->ColumnsCount; n++)
            table->DisplayOrderToIndex[n] = table->Columns[n].DisplayOrder = (ImGuiTableColumnIdx)n;
        table->IsResetDisplayOrderRequest = false;
        table->IsSettingsDirty = true;
    }
}